

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O2

void __thiscall boundingBoxTy::enlarge_m(boundingBoxTy *this,double x,double y)

{
  double dVar1;
  vectorTy local_30;
  
  dVar1 = (double)(~-(ulong)NAN(y) & (ulong)y | -(ulong)NAN(y) & (ulong)x);
  dVar1 = SQRT(x * x + dVar1 * dVar1);
  local_30.angle = 315.0;
  local_30.vsi = NAN;
  local_30.speed = NAN;
  local_30.dist = dVar1;
  positionTy::operator+=(&this->nw,&local_30);
  local_30.angle = 135.0;
  local_30.vsi = NAN;
  local_30.speed = NAN;
  local_30.dist = dVar1;
  positionTy::operator+=(&this->se,&local_30);
  return;
}

Assistant:

void boundingBoxTy::enlarge_m (double x, double y)
{
    // height defaults to width
    if (std::isnan(y)) y = x;
    
    // we move 45 degrees from the center point to the nw and se corners,
    // use good ole pythagoras, probably not _exact_ but good enough here
    const double d = sqrt(x*x + y*y);
    
    // let's move the corners out:
    nw += vectorTy ( 315, d, NAN, NAN );
    se += vectorTy ( 135, d, NAN, NAN );
}